

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

void do_cmd_buy_stat(command *cmd)

{
  int *in_RCX;
  int *points_spent_local;
  int *in_R8;
  undefined1 in_R9B;
  wchar_t choice;
  
  if (rolled_stats == '\0') {
    cmd_get_arg_choice((command_conflict *)cmd,"choice",&choice);
    buy_stat(choice,(int *)0x1,points_spent_local,in_RCX,in_R8,(_Bool)in_R9B);
  }
  return;
}

Assistant:

void do_cmd_buy_stat(struct command *cmd)
{
	/* .choice is the stat to sell */
	if (!rolled_stats) {
		int choice;
		cmd_get_arg_choice(cmd, "choice", &choice);
		buy_stat(choice, stats, points_spent, points_inc,
			&points_left, true);
	}
}